

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QWidget * embeddedWidget(QWidget *w)

{
  bool bVar1;
  QWidget *pQVar2;
  QObject *this;
  QAbstractScrollArea *this_00;
  
  pQVar2 = &QtPrivate::qobject_cast_helper<QComboBox*,QObject>(&w->super_QObject)->super_QWidget;
  if (pQVar2 == (QWidget *)0x0) {
    this = (QObject *)QtPrivate::qobject_cast_helper<QAbstractSpinBox*,QObject>(&w->super_QObject);
    if (this != (QObject *)0x0) {
      pQVar2 = &QObject::findChild<QLineEdit*>(this,(FindChildOptions)0x1)->super_QWidget;
      return pQVar2;
    }
    this_00 = (QAbstractScrollArea *)
              QtPrivate::qobject_cast_helper<QAbstractScrollArea*,QObject>(&w->super_QObject);
    pQVar2 = w;
    if (this_00 != (QAbstractScrollArea *)0x0) {
      pQVar2 = QAbstractScrollArea::viewport(this_00);
      return pQVar2;
    }
  }
  else {
    bVar1 = QComboBox::isEditable((QComboBox *)pQVar2);
    if (bVar1) {
      pQVar2 = &QComboBox::lineEdit((QComboBox *)pQVar2)->super_QWidget;
      return pQVar2;
    }
  }
  return pQVar2;
}

Assistant:

static QWidget *embeddedWidget(QWidget *w)
{
#if QT_CONFIG(combobox)
    if (QComboBox *cmb = qobject_cast<QComboBox *>(w)) {
        if (cmb->isEditable())
            return cmb->lineEdit();
        else
            return cmb;
    }
#endif

#if QT_CONFIG(spinbox)
    if (QAbstractSpinBox *sb = qobject_cast<QAbstractSpinBox *>(w))
        return sb->findChild<QLineEdit *>();
#endif

#if QT_CONFIG(scrollarea)
    if (QAbstractScrollArea *sa = qobject_cast<QAbstractScrollArea *>(w))
        return sa->viewport();
#endif

    return w;
}